

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secret_manager.cpp
# Opt level: O1

void __thiscall
duckdb::SecretManager::ThrowTypeNotFoundError(SecretManager *this,string *type,string *secret_path)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  size_type sVar3;
  InvalidInputException *this_00;
  long *plVar4;
  string *in_RCX;
  long *plVar5;
  size_type *psVar6;
  string error_message;
  string entry;
  string local_170;
  string local_150;
  long *local_130;
  long local_128;
  long local_120;
  long lStack_118;
  long *local_110;
  long local_108;
  long local_100;
  long lStack_f8;
  string local_f0;
  string local_d0;
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  string local_90;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  StringUtil::Lower(&local_150,type);
  ExtensionHelper::FindExtensionInEntries<9ul>
            (&local_f0,(ExtensionHelper *)&local_150,(string *)&EXTENSION_SECRET_TYPES,
             (ExtensionEntry (*) [9])in_RCX);
  paVar1 = &local_150.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != paVar1) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  local_150._M_string_length = 0;
  local_150.field_2._M_local_buf[0] = '\0';
  local_150._M_dataplus._M_p = (pointer)paVar1;
  if ((local_f0._M_string_length == 0) || ((this->db).ptr == (DatabaseInstance *)0x0)) {
    local_70[0] = local_60;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_70,"Secret type \'%s\' not found","");
    pcVar2 = (type->_M_dataplus)._M_p;
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,pcVar2,pcVar2 + type->_M_string_length);
    StringUtil::Format<std::__cxx11::string>(&local_170,(StringUtil *)local_70,&local_90,in_RCX);
    ::std::__cxx11::string::operator=((string *)&local_150,(string *)&local_170);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if (local_70[0] != local_60) {
      operator_delete(local_70[0]);
    }
    sVar3 = secret_path->_M_string_length;
  }
  else {
    ::std::operator+(&local_50,"Secret type \'",type);
    plVar4 = (long *)::std::__cxx11::string::append((char *)&local_50);
    local_110 = (long *)*plVar4;
    plVar5 = plVar4 + 2;
    if (local_110 == plVar5) {
      local_100 = *plVar5;
      lStack_f8 = plVar4[3];
      local_110 = &local_100;
    }
    else {
      local_100 = *plVar5;
    }
    local_108 = plVar4[1];
    *plVar4 = (long)plVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)::std::__cxx11::string::_M_append
                               ((char *)&local_110,(ulong)local_f0._M_dataplus._M_p);
    local_130 = (long *)*plVar4;
    plVar5 = plVar4 + 2;
    if (local_130 == plVar5) {
      local_120 = *plVar5;
      lStack_118 = plVar4[3];
      local_130 = &local_120;
    }
    else {
      local_120 = *plVar5;
    }
    local_128 = plVar4[1];
    *plVar4 = (long)plVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)::std::__cxx11::string::append((char *)&local_130);
    paVar1 = &local_170.field_2;
    local_170._M_dataplus._M_p = (pointer)*plVar4;
    psVar6 = (size_type *)(plVar4 + 2);
    if ((size_type *)local_170._M_dataplus._M_p == psVar6) {
      local_170.field_2._M_allocated_capacity = *psVar6;
      local_170.field_2._8_8_ = plVar4[3];
      local_170._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_170.field_2._M_allocated_capacity = *psVar6;
    }
    local_170._M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    ::std::__cxx11::string::operator=((string *)&local_150,(string *)&local_170);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != paVar1) {
      operator_delete(local_170._M_dataplus._M_p);
    }
    if (local_130 != &local_120) {
      operator_delete(local_130);
    }
    if (local_110 != &local_100) {
      operator_delete(local_110);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    optional_ptr<duckdb::DatabaseInstance,_true>::CheckValid(&this->db);
    in_RCX = &local_f0;
    ExtensionHelper::AddExtensionInstallHintToErrorMsg(&local_170,(this->db).ptr,&local_150,in_RCX);
    ::std::__cxx11::string::operator=((string *)&local_150,(string *)&local_170);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != paVar1) {
      operator_delete(local_170._M_dataplus._M_p);
    }
    sVar3 = secret_path->_M_string_length;
  }
  if (sVar3 != 0) {
    ::std::__cxx11::string::append((char *)&local_150);
  }
  if (secret_path->_M_string_length != 0) {
    local_b0[0] = local_a0;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_b0,"try removing the secret at path \'%s\'.","");
    pcVar2 = (secret_path->_M_dataplus)._M_p;
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d0,pcVar2,pcVar2 + secret_path->_M_string_length);
    StringUtil::Format<std::__cxx11::string>(&local_170,(StringUtil *)local_b0,&local_d0,in_RCX);
    ::std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_170._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if (local_b0[0] != local_a0) {
      operator_delete(local_b0[0]);
    }
  }
  this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  InvalidInputException::InvalidInputException(this_00,&local_150);
  __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void SecretManager::ThrowTypeNotFoundError(const string &type, const string &secret_path) {
	auto entry = ExtensionHelper::FindExtensionInEntries(StringUtil::Lower(type), EXTENSION_SECRET_TYPES);
	string error_message;

	if (!entry.empty() && db) {
		error_message = "Secret type '" + type + "' does not exist, but it exists in the " + entry + " extension.";
		error_message = ExtensionHelper::AddExtensionInstallHintToErrorMsg(*db, error_message, entry);

		if (!secret_path.empty()) {
			error_message += "\n\nAlternatively, ";
		}
	} else {
		error_message = StringUtil::Format("Secret type '%s' not found", type);

		if (!secret_path.empty()) {
			error_message += ", ";
		}
	}

	if (!secret_path.empty()) {
		error_message += StringUtil::Format("try removing the secret at path '%s'.", secret_path);
	}

	throw InvalidInputException(error_message);
}